

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

int yyText(GREG *G,int begin,int end)

{
  char *__dest;
  int iVar1;
  uint uVar2;
  
  uVar2 = end - begin;
  if (uVar2 == 0 || end < begin) {
    uVar2 = 0;
  }
  else {
    __dest = G->text;
    iVar1 = G->textlen;
    while (iVar1 <= (int)uVar2) {
      G->textlen = iVar1 * 2;
      __dest = (char *)realloc(__dest,(long)(iVar1 * 2));
      G->text = __dest;
      iVar1 = G->textlen;
    }
    memcpy(__dest,G->buf + begin,(ulong)uVar2);
  }
  G->text[uVar2] = '\0';
  return uVar2;
}

Assistant:

YY_LOCAL(int) yyText(GREG *G, int begin, int end)
{
  int yyleng= end - begin;
  if (yyleng <= 0)
    yyleng= 0;
  else
    {
      while (G->textlen < (yyleng + 1))
        {
          G->textlen *= 2;
          G->text= (char*)YY_REALLOC(G->text, G->textlen, G->data);
        }
      memcpy(G->text, G->buf + begin, yyleng);
    }
  G->text[yyleng]= '\0';
  return yyleng;
}